

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O2

void GccPlatformSpecificRunTestInASeperateProcess
               (UtestShell *shell,TestPlugin *plugin,TestResult *result)

{
  ulong uVar1;
  int iVar2;
  int __pid;
  uint uVar3;
  int *piVar4;
  long lVar5;
  int status;
  UtestShell *local_b8;
  SimpleString message;
  TestFailure local_98;
  
  status = 0;
  iVar2 = (*PlatformSpecificFork)();
  if (iVar2 == -1) {
    SimpleString::SimpleString(&message,"Call to fork() failed");
    TestFailure::TestFailure(&local_98,shell,&message);
    (*result->_vptr_TestResult[0xd])(result,&local_98);
LAB_0023d38c:
    TestFailure::~TestFailure(&local_98);
    SimpleString::~SimpleString(&message);
    return;
  }
  local_b8 = shell;
  if (iVar2 == 0) {
    uVar1 = result->failureCount_;
    (*shell->_vptr_UtestShell[0x25])(shell,plugin,result);
    _exit((uint)(uVar1 < result->failureCount_));
  }
  lVar5 = 0;
  do {
    while (__pid = (*PlatformSpecificWaitPid)(iVar2,&status,2), __pid != -1) {
      if ((status & 0xff00U) == 0 || (status & 0x7fU) != 0) {
        if (0x1ffffff < (int)((status & 0x7fU) * 0x1000000 + 0x1000000)) {
          SimpleString::SimpleString(&message,"Failed in separate process - killed by signal ");
          StringFrom((int)&local_98);
          SimpleString::operator+=(&message,(SimpleString *)&local_98);
          SimpleString::~SimpleString((SimpleString *)&local_98);
          TestFailure::TestFailure(&local_98,local_b8,&message);
          (*result->_vptr_TestResult[0xd])(result,&local_98);
          goto LAB_0023d289;
        }
        if ((char)status == '\x7f') {
          SimpleString::SimpleString(&message,"Stopped in separate process - continuing");
          TestFailure::TestFailure(&local_98,local_b8,&message);
          (*result->_vptr_TestResult[0xd])(result,&local_98);
          goto LAB_0023d289;
        }
      }
      else {
        SimpleString::SimpleString(&message,"Failed in separate process");
        TestFailure::TestFailure(&local_98,local_b8,&message);
        (*result->_vptr_TestResult[0xd])(result,&local_98);
LAB_0023d289:
        TestFailure::~TestFailure(&local_98);
        SimpleString::~SimpleString(&message);
      }
      uVar3 = status & 0xff;
      if ((char)status == '\x7f') {
        kill(__pid,0x12);
        uVar3 = status;
      }
      if ((uVar3 & 0x7f) == 0) {
        return;
      }
      if (0x1ffffff < (int)((uVar3 & 0x7f) * 0x1000000 + 0x1000000)) {
        return;
      }
    }
    piVar4 = __errno_location();
    if (*piVar4 != 4) {
      SimpleString::SimpleString(&message,"Call to waitpid() failed");
      TestFailure::TestFailure(&local_98,local_b8,&message);
      (*result->_vptr_TestResult[0xd])(result,&local_98);
      goto LAB_0023d38c;
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 0x20) {
      SimpleString::SimpleString
                (&message,
                 "Call to waitpid() failed with EINTR. Tried 30 times and giving up! Sometimes happens in debugger"
                );
      TestFailure::TestFailure(&local_98,local_b8,&message);
      (*result->_vptr_TestResult[0xd])(result,&local_98);
      goto LAB_0023d38c;
    }
  } while( true );
}

Assistant:

static void GccPlatformSpecificRunTestInASeperateProcess(UtestShell* shell, TestPlugin* plugin, TestResult* result)
{
    const pid_t syscallError = -1;
    pid_t cpid;
    pid_t w;
    int status = 0;

    cpid = PlatformSpecificFork();

    if (cpid == syscallError) {
        result->addFailure(TestFailure(shell, "Call to fork() failed"));
        return;
    }

    if (cpid == 0) {            /* Code executed by child */
        const size_t initialFailureCount = result->getFailureCount(); // LCOV_EXCL_LINE
        shell->runOneTestInCurrentProcess(plugin, *result);        // LCOV_EXCL_LINE
        _exit(initialFailureCount < result->getFailureCount());    // LCOV_EXCL_LINE
    } else {                    /* Code executed by parent */
        size_t amountOfRetries = 0;
        do {
            w = PlatformSpecificWaitPid(cpid, &status, WUNTRACED);
            if (w == syscallError) {
                // OS X debugger causes EINTR
                if (EINTR == errno) {
                  if (amountOfRetries > 30) {
                    result->addFailure(TestFailure(shell, "Call to waitpid() failed with EINTR. Tried 30 times and giving up! Sometimes happens in debugger"));
                    return;
                  }
                  amountOfRetries++;
                }
                else {
                    result->addFailure(TestFailure(shell, "Call to waitpid() failed"));
                    return;
                }
            } else {
                SetTestFailureByStatusCode(shell, result, status);
                if (WIFSTOPPED(status)) kill(w, SIGCONT);
            }
        } while ((w == syscallError) || (!WIFEXITED(status) && !WIFSIGNALED(status)));
    }
}